

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventsProcessor.cpp
# Opt level: O3

void __thiscall solitaire::events::EventsProcessor::processEvents(EventsProcessor *this)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char extraout_DL;
  char extraout_DL_00;
  _Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  local_20 [2];
  
  local_20[0]._0_4_ =
       (*((this->eventsSource)._M_t.
          super___uniq_ptr_impl<solitaire::events::interfaces::EventsSource,_std::default_delete<solitaire::events::interfaces::EventsSource>_>
          ._M_t.
          super__Tuple_impl<0UL,_solitaire::events::interfaces::EventsSource_*,_std::default_delete<solitaire::events::interfaces::EventsSource>_>
          .super__Head_base<0UL,_solitaire::events::interfaces::EventsSource_*,_false>._M_head_impl)
         ->_vptr_EventsSource[2])();
  local_20[0]._4_4_ = extraout_var;
  if (extraout_DL != '\0') {
    do {
      processEvent(this,(Event *)local_20);
      iVar1 = (*(this->super_EventsProcessor)._vptr_EventsProcessor[3])(this);
      if ((char)iVar1 != '\0') {
        return;
      }
      local_20[0]._0_4_ =
           (*((this->eventsSource)._M_t.
              super___uniq_ptr_impl<solitaire::events::interfaces::EventsSource,_std::default_delete<solitaire::events::interfaces::EventsSource>_>
              ._M_t.
              super__Tuple_impl<0UL,_solitaire::events::interfaces::EventsSource_*,_std::default_delete<solitaire::events::interfaces::EventsSource>_>
              .super__Head_base<0UL,_solitaire::events::interfaces::EventsSource_*,_false>.
             _M_head_impl)->_vptr_EventsSource[2])();
      local_20[0]._4_4_ = extraout_var_00;
    } while (extraout_DL_00 != '\0');
  }
  return;
}

Assistant:

void EventsProcessor::processEvents() {
    Event event = eventsSource->getEvent();
    while (eventOccured(event)) {
        processEvent(event);
        if (shouldQuit()) return;
        event = eventsSource->getEvent();
    }
}